

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu383.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu383_deinit(void *hal)

{
  MPP_RET local_24;
  MPP_RET ret;
  HalVp9dCtx *p_hal;
  void *hal_local;
  
  local_24 = MPP_OK;
  hal_vp9d_release_res((HalVp9dCtx *)hal);
  if ((*(long *)((long)hal + 0x28) == 0) ||
     (local_24 = mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x28)), local_24 == MPP_OK)) {
    if (*(long *)((long)hal + 0x40) != 0) {
      mpp_osal_free("hal_vp9d_vdpu383_deinit",*(void **)((long)hal + 0x40));
    }
    *(undefined8 *)((long)hal + 0x40) = 0;
    hal_local._4_4_ = local_24;
  }
  else {
    _mpp_log_l(2,"hal_vp9d_vdpu383","vp9d group free buffer failed\n",(char *)0x0);
    hal_local._4_4_ = local_24;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_vp9d_vdpu383_deinit(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;
    MPP_RET ret = MPP_OK;

    hal_vp9d_release_res(p_hal);

    if (p_hal->group) {
        ret = mpp_buffer_group_put(p_hal->group);
        if (ret) {
            mpp_err("vp9d group free buffer failed\n");
            return ret;
        }
    }
    MPP_FREE(p_hal->hw_ctx);

    return ret;
}